

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::ELU_x86_fma::forward_inplace(ELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [24];
  long *in_RSI;
  long *in_RDI;
  double dVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  float fVar49;
  __m128 _p_1;
  __m128 _alpha128;
  __m256 _p;
  __m256 _alpha256;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *m;
  __m256 neg;
  __m256 pos;
  __m128 neg_1;
  __m128 pos_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  int local_1738;
  undefined8 local_1728;
  undefined8 local_1720;
  undefined8 local_1718;
  undefined4 local_1710;
  long local_1708;
  undefined4 local_1700;
  undefined4 local_16fc;
  undefined4 local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined8 local_16e8;
  undefined1 (*local_16e0) [32];
  int local_16d8;
  int local_16d4;
  int local_16d0;
  int local_16cc;
  int local_16c8;
  int local_16c4;
  long *local_16b8;
  undefined1 local_16a5;
  int local_16a4;
  undefined8 *local_1698;
  undefined8 *local_1690;
  undefined8 *local_1680;
  uint local_166c;
  undefined1 (*local_1668) [32];
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  undefined1 (*local_1628) [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined4 local_1594;
  float local_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  float local_157c;
  undefined1 (*local_1578) [32];
  float local_1570;
  float fStack_156c;
  float fStack_1568;
  float fStack_1564;
  undefined1 (*local_1558) [32];
  undefined1 local_1550 [16];
  undefined1 local_1540 [16];
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined4 local_1510;
  undefined4 uStack_150c;
  undefined4 uStack_1508;
  undefined4 uStack_1504;
  undefined4 local_14f4;
  long local_14f0;
  undefined4 local_14e4;
  long local_14e0;
  undefined1 (*local_14d8) [32];
  undefined4 local_14cc;
  int local_14c8;
  int local_14c4;
  undefined8 *local_14c0;
  undefined4 local_14b4;
  long local_14b0;
  undefined8 *local_1490;
  undefined1 local_1460 [32];
  undefined4 local_1440;
  undefined4 local_143c;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined4 local_142c;
  undefined4 local_1428;
  undefined4 local_1424;
  undefined1 local_1420 [32];
  uint local_1400;
  uint local_13fc;
  uint local_13f8;
  uint local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  uint local_13e4;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  ulong uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  ulong uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 local_12c0 [8];
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [32];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [32];
  undefined1 local_1220 [8];
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [32];
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [32];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined1 local_10a0 [8];
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined4 local_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined4 local_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined4 local_654;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  ulong uStack_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  ulong uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined4 local_514;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_16c4 = *(int *)((long)in_RSI + 0x2c);
  local_16c8 = (int)in_RSI[6];
  local_16cc = (int)in_RSI[7];
  local_16d0 = (int)in_RSI[3];
  local_16d4 = local_16c4 * local_16c8 * local_16d0;
  local_16b8 = in_RSI;
  for (local_16d8 = 0; local_16d8 < local_16cc; local_16d8 = local_16d8 + 1) {
    local_1698 = &local_1728;
    local_14c4 = *(int *)((long)local_16b8 + 0x2c);
    local_14c8 = (int)local_16b8[6];
    local_14cc = *(undefined4 *)((long)local_16b8 + 0x34);
    local_14d8 = (undefined1 (*) [32])
                 (*local_16b8 + local_16b8[8] * (long)local_16d8 * local_16b8[2]);
    local_14e0 = local_16b8[2];
    local_14e4 = (undefined4)local_16b8[3];
    local_14f0 = local_16b8[4];
    local_14c0 = &local_1728;
    local_14b0 = (long)local_14c4 * (long)local_14c8 * local_14e0;
    local_1690 = &local_1728;
    local_1680 = &local_1728;
    local_14b4 = 0x10;
    local_16a4 = local_16d8;
    local_16a5 = 1;
    local_1728 = 0;
    local_1718 = 0;
    local_1710 = 0;
    local_1700 = 0;
    local_16fc = 0;
    local_16f8 = 0;
    local_16f4 = 0;
    local_16f0 = 0;
    local_16e8 = 0;
    local_1720 = 0;
    local_1738 = 0;
    local_166c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    auVar1 = vinsertps_avx(ZEXT416(local_166c),ZEXT416(local_166c),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_166c),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_166c),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_166c),ZEXT416(local_166c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_166c),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_166c),0x30);
    auVar46._16_16_ = auVar1;
    auVar46._0_16_ = auVar2;
    local_1420._0_8_ = auVar2._0_8_;
    local_1420._8_8_ = auVar2._8_8_;
    local_1420._16_8_ = auVar1._0_8_;
    local_1420._24_8_ = auVar1._8_8_;
    local_16e0 = local_14d8;
    for (; local_1738 + 7 < local_16d4; local_1738 = local_1738 + 8) {
      local_1668 = local_16e0;
      local_15c0 = *(undefined8 *)*local_16e0;
      uStack_15b8 = *(undefined8 *)(*local_16e0 + 8);
      uStack_15b0 = *(undefined8 *)(*local_16e0 + 0x10);
      uStack_15a8 = *(undefined8 *)(*local_16e0 + 0x18);
      local_1628 = local_16e0;
      local_15e0 = local_1420._0_8_;
      uStack_15d8 = local_1420._8_8_;
      uStack_15d0 = local_1420._16_8_;
      uStack_15c8 = local_1420._24_8_;
      local_13a0 = ZEXT832(0) << 0x20;
      local_13c0 = 0;
      local_1380._8_8_ = SUB328(ZEXT832(0),4);
      uStack_13b8 = local_1380._8_8_;
      uStack_13b0 = 0;
      uStack_13a8 = 0;
      local_1600 = vmaxps_avx(ZEXT832((ulong)local_1380._8_8_) << 0x40,*local_16e0);
      local_1340 = 0;
      uStack_1338 = local_1380._8_8_;
      uStack_1330 = 0;
      uStack_1328 = 0;
      auVar5 = vminps_avx(ZEXT832((ulong)local_1380._8_8_) << 0x40,*local_16e0);
      local_1620._0_8_ = auVar5._0_8_;
      local_1620._24_8_ = auVar5._24_8_;
      local_11a0 = ZEXT832(0) << 0x20;
      local_1280 = 0x3f8000003f800000;
      uStack_1278 = 0x3f8000003f800000;
      uStack_1270 = 0x3f8000003f800000;
      uStack_1268 = 0x3f8000003f800000;
      local_1160 = local_1620._0_8_;
      local_1200._8_8_ = auVar5._8_8_;
      uStack_1158 = local_1200._8_8_;
      local_1200._16_8_ = auVar5._16_8_;
      uStack_1150 = local_1200._16_8_;
      uStack_1148 = local_1620._24_8_;
      local_1180 = 0x42b0c0a542b0c0a5;
      uStack_1178 = 0x42b0c0a542b0c0a5;
      uStack_1170 = 0x42b0c0a542b0c0a5;
      uStack_1168 = 0x42b0c0a542b0c0a5;
      auVar13._8_8_ = 0x42b0c0a542b0c0a5;
      auVar13._0_8_ = 0x42b0c0a542b0c0a5;
      auVar13._16_8_ = 0x42b0c0a542b0c0a5;
      auVar13._24_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(auVar5,auVar13);
      local_1200._0_8_ = auVar5._0_8_;
      local_11c0 = local_1200._0_8_;
      local_1200._8_8_ = auVar5._8_8_;
      uStack_11b8 = local_1200._8_8_;
      local_1200._16_8_ = auVar5._16_8_;
      uStack_11b0 = local_1200._16_8_;
      local_1200._24_8_ = auVar5._24_8_;
      uStack_11a8 = local_1200._24_8_;
      local_11e0 = 0xc2b0c0a5c2b0c0a5;
      uStack_11d8 = 0xc2b0c0a5c2b0c0a5;
      uStack_11d0 = 0xc2b0c0a5c2b0c0a5;
      uStack_11c8 = 0xc2b0c0a5c2b0c0a5;
      auVar6._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar5,auVar6);
      local_1200._0_8_ = auVar4._0_8_;
      local_d40 = local_1200._0_8_;
      local_1200._8_8_ = auVar4._8_8_;
      uStack_d38 = local_1200._8_8_;
      local_1200._16_8_ = auVar4._16_8_;
      uStack_d30 = local_1200._16_8_;
      local_1200._24_8_ = auVar4._24_8_;
      uStack_d28 = local_1200._24_8_;
      local_d60 = 0x3fb8aa3b3fb8aa3b;
      uStack_d58 = 0x3fb8aa3b3fb8aa3b;
      uStack_d50 = 0x3fb8aa3b3fb8aa3b;
      uStack_d48 = 0x3fb8aa3b3fb8aa3b;
      local_f60 = 0x3f0000003f000000;
      uStack_f58 = 0x3f0000003f000000;
      uStack_f50 = 0x3f0000003f000000;
      uStack_f48 = 0x3f0000003f000000;
      local_9e0 = local_1200._0_8_;
      uStack_9d8 = local_1200._8_8_;
      uStack_9d0 = local_1200._16_8_;
      uStack_9c8 = local_1200._24_8_;
      local_a00 = 0x3fb8aa3b3fb8aa3b;
      uStack_9f8 = 0x3fb8aa3b3fb8aa3b;
      uStack_9f0 = 0x3fb8aa3b3fb8aa3b;
      uStack_9e8 = 0x3fb8aa3b3fb8aa3b;
      local_a20 = 0x3f0000003f000000;
      uStack_a18 = 0x3f0000003f000000;
      uStack_a10 = 0x3f0000003f000000;
      uStack_a08 = 0x3f0000003f000000;
      auVar16._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar16._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar16._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar16._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar15._8_8_ = 0x3f0000003f000000;
      auVar15._0_8_ = 0x3f0000003f000000;
      auVar15._16_8_ = 0x3f0000003f000000;
      auVar15._24_8_ = 0x3f0000003f000000;
      auVar7 = vfmadd213ps_fma(auVar16,auVar4,auVar15);
      auVar6 = vroundps_avx(ZEXT1632(auVar7),1);
      auVar5 = vcmpps_avx(ZEXT1632(auVar7),auVar6,1);
      local_12a0._0_8_ = auVar5._0_8_;
      local_d00 = local_12a0._0_8_;
      local_12a0._8_8_ = auVar5._8_8_;
      uStack_cf8 = local_12a0._8_8_;
      local_12a0._16_8_ = auVar5._16_8_;
      uStack_cf0 = local_12a0._16_8_;
      local_12a0._24_8_ = auVar5._24_8_;
      uStack_ce8 = local_12a0._24_8_;
      local_d20 = 0x3f8000003f800000;
      uStack_d18 = 0x3f8000003f800000;
      uStack_d10 = 0x3f8000003f800000;
      uStack_d08 = 0x3f8000003f800000;
      auVar14._8_8_ = 0x3f8000003f800000;
      auVar14._0_8_ = 0x3f8000003f800000;
      auVar14._16_8_ = 0x3f8000003f800000;
      auVar14._24_8_ = 0x3f8000003f800000;
      local_12a0 = vandps_avx(auVar5,auVar14);
      local_1220 = auVar6._0_8_;
      local_1120 = local_1220;
      uStack_1218 = auVar6._8_8_;
      uStack_1118 = uStack_1218;
      uStack_1210 = auVar6._16_8_;
      uStack_1110 = uStack_1210;
      uStack_1208 = auVar6._24_8_;
      uStack_1108 = uStack_1208;
      local_1140 = local_12a0._0_8_;
      uStack_1138 = local_12a0._8_8_;
      uStack_1130 = local_12a0._16_8_;
      uStack_1128 = local_12a0._24_8_;
      local_1240 = vsubps_avx(auVar6,local_12a0);
      local_c40 = local_1240._0_8_;
      uStack_c38 = local_1240._8_8_;
      uStack_c30 = local_1240._16_8_;
      uStack_c28 = local_1240._24_8_;
      local_c80 = local_1200._0_8_;
      uStack_c78 = local_1200._8_8_;
      uStack_c70 = local_1200._16_8_;
      uStack_c68 = local_1200._24_8_;
      local_c60 = 0x3f3180003f318000;
      uStack_c58 = 0x3f3180003f318000;
      uStack_c50 = 0x3f3180003f318000;
      uStack_c48 = 0x3f3180003f318000;
      local_740 = local_1240._0_8_;
      uStack_738 = local_1240._8_8_;
      uStack_730 = local_1240._16_8_;
      uStack_728 = local_1240._24_8_;
      local_760 = 0x3f3180003f318000;
      uStack_758 = 0x3f3180003f318000;
      uStack_750 = 0x3f3180003f318000;
      uStack_748 = 0x3f3180003f318000;
      local_780 = local_1200._0_8_;
      uStack_778 = local_1200._8_8_;
      uStack_770 = local_1200._16_8_;
      uStack_768 = local_1200._24_8_;
      auVar23._8_8_ = 0x3f3180003f318000;
      auVar23._0_8_ = 0x3f3180003f318000;
      auVar23._16_8_ = 0x3f3180003f318000;
      auVar23._24_8_ = 0x3f3180003f318000;
      auVar7 = vfnmadd213ps_fma(auVar23,local_1240,auVar4);
      local_ca0 = local_1240._0_8_;
      uStack_c98 = local_1240._8_8_;
      uStack_c90 = local_1240._16_8_;
      uStack_c88 = local_1240._24_8_;
      local_1200._0_8_ = auVar7._0_8_;
      local_ce0 = local_1200._0_8_;
      local_1200._8_8_ = auVar7._8_8_;
      uStack_cd8 = local_1200._8_8_;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_cc0 = 0xb95e8083b95e8083;
      uStack_cb8 = 0xb95e8083b95e8083;
      uStack_cb0 = 0xb95e8083b95e8083;
      uStack_ca8 = 0xb95e8083b95e8083;
      local_6e0 = local_1240._0_8_;
      uStack_6d8 = local_1240._8_8_;
      uStack_6d0 = local_1240._16_8_;
      uStack_6c8 = local_1240._24_8_;
      local_700 = 0xb95e8083b95e8083;
      uStack_6f8 = 0xb95e8083b95e8083;
      uStack_6f0 = 0xb95e8083b95e8083;
      uStack_6e8 = 0xb95e8083b95e8083;
      local_720 = local_1200._0_8_;
      uStack_718 = local_1200._8_8_;
      uStack_710 = 0;
      uStack_708 = 0;
      auVar24._8_8_ = 0xb95e8083b95e8083;
      auVar24._0_8_ = 0xb95e8083b95e8083;
      auVar24._16_8_ = 0xb95e8083b95e8083;
      auVar24._24_8_ = 0xb95e8083b95e8083;
      auVar8 = vfnmadd213ps_fma(auVar24,local_1240,ZEXT1632(auVar7));
      local_1200._0_8_ = auVar8._0_8_;
      local_1040 = local_1200._0_8_;
      local_1200._8_8_ = auVar8._8_8_;
      uStack_1038 = local_1200._8_8_;
      uStack_1030 = 0;
      uStack_1028 = 0;
      local_1020._0_4_ = auVar8._0_4_;
      local_1020._4_4_ = auVar8._4_4_;
      uStack_1018._0_4_ = auVar8._8_4_;
      uStack_1018._4_4_ = auVar8._12_4_;
      local_1220._4_4_ = local_1020._4_4_ * local_1020._4_4_;
      local_1220._0_4_ = (float)local_1020 * (float)local_1020;
      local_fa0 = local_1220;
      uStack_1218._0_4_ = (float)uStack_1018 * (float)uStack_1018;
      uStack_1218._4_4_ = uStack_1018._4_4_ * uStack_1018._4_4_;
      auVar3 = _local_1220;
      _local_1220 = ZEXT1632(_local_1220);
      auVar13 = _local_1220;
      uStack_12b8 = 0x3950696739506967;
      local_12c0 = (undefined1  [8])0x3950696739506967;
      local_da0 = 0x3950696739506967;
      uStack_d98 = 0x3950696739506967;
      uStack_d90 = 0x3950696739506967;
      uStack_d88 = 0x3950696739506967;
      local_dc0 = local_1200._0_8_;
      uStack_db8 = local_1200._8_8_;
      uStack_db0 = 0;
      uStack_da8 = 0;
      local_de0 = 0x3ab743ce3ab743ce;
      uStack_dd8 = 0x3ab743ce3ab743ce;
      uStack_dd0 = 0x3ab743ce3ab743ce;
      uStack_dc8 = 0x3ab743ce3ab743ce;
      local_980 = 0x3950696739506967;
      uStack_978 = 0x3950696739506967;
      uStack_970 = 0x3950696739506967;
      uStack_968 = 0x3950696739506967;
      local_9a0 = local_1200._0_8_;
      uStack_998 = local_1200._8_8_;
      uStack_990 = 0;
      uStack_988 = 0;
      local_9c0 = 0x3ab743ce3ab743ce;
      uStack_9b8 = 0x3ab743ce3ab743ce;
      uStack_9b0 = 0x3ab743ce3ab743ce;
      uStack_9a8 = 0x3ab743ce3ab743ce;
      auVar18._16_8_ = 0x3950696739506967;
      auVar18._0_16_ = _local_12c0;
      auVar18._24_8_ = 0x3950696739506967;
      auVar17._8_8_ = 0x3ab743ce3ab743ce;
      auVar17._0_8_ = 0x3ab743ce3ab743ce;
      auVar17._16_8_ = 0x3ab743ce3ab743ce;
      auVar17._24_8_ = 0x3ab743ce3ab743ce;
      auVar7 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar18,auVar17);
      local_12c0 = auVar7._0_8_;
      local_e00 = local_12c0;
      uStack_12b8 = auVar7._8_8_;
      uStack_df8 = uStack_12b8;
      uStack_df0 = 0;
      uStack_de8 = 0;
      local_e20 = local_1200._0_8_;
      uStack_e18 = local_1200._8_8_;
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_e40 = 0x3c0889083c088908;
      uStack_e38 = 0x3c0889083c088908;
      uStack_e30 = 0x3c0889083c088908;
      uStack_e28 = 0x3c0889083c088908;
      local_920 = local_12c0;
      uStack_918 = uStack_12b8;
      uStack_910 = 0;
      uStack_908 = 0;
      local_940 = local_1200._0_8_;
      uStack_938 = local_1200._8_8_;
      uStack_930 = 0;
      uStack_928 = 0;
      local_960 = 0x3c0889083c088908;
      uStack_958 = 0x3c0889083c088908;
      uStack_950 = 0x3c0889083c088908;
      uStack_948 = 0x3c0889083c088908;
      auVar19._8_8_ = 0x3c0889083c088908;
      auVar19._0_8_ = 0x3c0889083c088908;
      auVar19._16_8_ = 0x3c0889083c088908;
      auVar19._24_8_ = 0x3c0889083c088908;
      auVar7 = vfmadd213ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar7),auVar19);
      local_12c0 = auVar7._0_8_;
      local_e60 = local_12c0;
      uStack_12b8 = auVar7._8_8_;
      uStack_e58 = uStack_12b8;
      uStack_e50 = 0;
      uStack_e48 = 0;
      local_e80 = local_1200._0_8_;
      uStack_e78 = local_1200._8_8_;
      uStack_e70 = 0;
      uStack_e68 = 0;
      local_ea0 = 0x3d2aa9c13d2aa9c1;
      uStack_e98 = 0x3d2aa9c13d2aa9c1;
      uStack_e90 = 0x3d2aa9c13d2aa9c1;
      uStack_e88 = 0x3d2aa9c13d2aa9c1;
      local_8c0 = local_12c0;
      uStack_8b8 = uStack_12b8;
      uStack_8b0 = 0;
      uStack_8a8 = 0;
      local_8e0 = local_1200._0_8_;
      uStack_8d8 = local_1200._8_8_;
      uStack_8d0 = 0;
      uStack_8c8 = 0;
      local_900 = 0x3d2aa9c13d2aa9c1;
      uStack_8f8 = 0x3d2aa9c13d2aa9c1;
      uStack_8f0 = 0x3d2aa9c13d2aa9c1;
      uStack_8e8 = 0x3d2aa9c13d2aa9c1;
      auVar20._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar20._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar20._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar20._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar7 = vfmadd213ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar7),auVar20);
      local_12c0 = auVar7._0_8_;
      local_ec0 = local_12c0;
      uStack_12b8 = auVar7._8_8_;
      uStack_eb8 = uStack_12b8;
      uStack_eb0 = 0;
      uStack_ea8 = 0;
      local_ee0 = local_1200._0_8_;
      uStack_ed8 = local_1200._8_8_;
      uStack_ed0 = 0;
      uStack_ec8 = 0;
      local_f00 = 0x3e2aaaaa3e2aaaaa;
      uStack_ef8 = 0x3e2aaaaa3e2aaaaa;
      uStack_ef0 = 0x3e2aaaaa3e2aaaaa;
      uStack_ee8 = 0x3e2aaaaa3e2aaaaa;
      local_860 = local_12c0;
      uStack_858 = uStack_12b8;
      uStack_850 = 0;
      uStack_848 = 0;
      local_880 = local_1200._0_8_;
      uStack_878 = local_1200._8_8_;
      uStack_870 = 0;
      uStack_868 = 0;
      local_8a0 = 0x3e2aaaaa3e2aaaaa;
      uStack_898 = 0x3e2aaaaa3e2aaaaa;
      uStack_890 = 0x3e2aaaaa3e2aaaaa;
      uStack_888 = 0x3e2aaaaa3e2aaaaa;
      auVar21._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar21._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar21._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar21._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar7 = vfmadd213ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar7),auVar21);
      local_12c0 = auVar7._0_8_;
      local_f20 = local_12c0;
      uStack_12b8 = auVar7._8_8_;
      uStack_f18 = uStack_12b8;
      uStack_f10 = 0;
      uStack_f08 = 0;
      local_f40 = local_1200._0_8_;
      uStack_f38 = local_1200._8_8_;
      uStack_f30 = 0;
      uStack_f28 = 0;
      local_800 = local_12c0;
      uStack_7f8 = uStack_12b8;
      uStack_7f0 = 0;
      uStack_7e8 = 0;
      local_820 = local_1200._0_8_;
      uStack_818 = local_1200._8_8_;
      uStack_810 = 0;
      uStack_808 = 0;
      local_840 = 0x3f0000003f000000;
      uStack_838 = 0x3f0000003f000000;
      uStack_830 = 0x3f0000003f000000;
      uStack_828 = 0x3f0000003f000000;
      auVar22._8_8_ = 0x3f0000003f000000;
      auVar22._0_8_ = 0x3f0000003f000000;
      auVar22._16_8_ = 0x3f0000003f000000;
      auVar22._24_8_ = 0x3f0000003f000000;
      auVar7 = vfmadd213ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar7),auVar22);
      local_12c0 = auVar7._0_8_;
      local_f80 = local_12c0;
      uStack_12b8 = auVar7._8_8_;
      uStack_f78 = uStack_12b8;
      uStack_f70 = 0;
      uStack_f68 = 0;
      uStack_1218 = auVar3._8_8_;
      uStack_f98 = uStack_1218;
      uStack_f90 = 0;
      uStack_f88 = 0;
      local_fc0 = local_1200._0_8_;
      uStack_fb8 = local_1200._8_8_;
      uStack_fb0 = 0;
      uStack_fa8 = 0;
      local_7a0 = local_12c0;
      uStack_798 = uStack_12b8;
      uStack_790 = 0;
      uStack_788 = 0;
      local_7c0 = local_fa0;
      uStack_7b8 = uStack_1218;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      local_7e0 = local_1200._0_8_;
      uStack_7d8 = local_1200._8_8_;
      uStack_7d0 = 0;
      uStack_7c8 = 0;
      auVar7 = vfmadd213ps_fma(ZEXT1632(auVar3),ZEXT1632(auVar7),ZEXT1632(auVar8));
      local_12c0 = auVar7._0_8_;
      uVar9 = local_12c0;
      uStack_12b8 = auVar7._8_8_;
      uVar10 = uStack_12b8;
      uStack_10d0 = 0;
      uStack_10c8 = 0;
      local_1100 = 0x3f8000003f800000;
      uStack_10f8 = 0x3f8000003f800000;
      uStack_10f0 = 0x3f8000003f800000;
      uStack_10e8 = 0x3f8000003f800000;
      local_10e0._0_4_ = auVar7._0_4_;
      local_10e0._4_4_ = auVar7._4_4_;
      uStack_10d8._0_4_ = auVar7._8_4_;
      uStack_10d8._4_4_ = auVar7._12_4_;
      local_12c0._4_4_ = local_10e0._4_4_ + 1.0;
      local_12c0._0_4_ = (float)local_10e0 + 1.0;
      uStack_12b8._0_4_ = (float)uStack_10d8 + 1.0;
      uStack_12b8._4_4_ = uStack_10d8._4_4_ + 1.0;
      uStack_12b0._0_4_ = 0x3f800000;
      uStack_12b0._4_4_ = 0x3f800000;
      auVar44 = _local_12c0;
      uStack_12a8._0_4_ = 0x3f800000;
      uStack_12a8._4_4_ = 0x3f800000;
      auVar5 = _local_12c0;
      local_c20._0_4_ = local_1240._0_4_;
      local_c20._4_4_ = local_1240._4_4_;
      uStack_c18._0_4_ = local_1240._8_4_;
      uStack_c18._4_4_ = local_1240._12_4_;
      uStack_c10._0_4_ = local_1240._16_4_;
      uStack_c10._4_4_ = local_1240._20_4_;
      uStack_c08._0_4_ = local_1240._24_4_;
      uStack_c08._4_4_ = local_1240._28_4_;
      local_1260 = CONCAT44((int)local_c20._4_4_,(int)(float)local_c20);
      uStack_1258 = CONCAT44((int)uStack_c18._4_4_,(int)(float)uStack_c18);
      uStack_1250 = CONCAT44((int)uStack_c10._4_4_,(int)(float)uStack_c10);
      uStack_1248 = CONCAT44((int)uStack_c08._4_4_,(int)(float)uStack_c08);
      local_b20 = local_1260;
      uStack_b18 = uStack_1258;
      uStack_b10 = uStack_1250;
      uStack_b08 = uStack_1248;
      local_b40 = 0x7f0000007f;
      uStack_b38 = 0x7f0000007f;
      uStack_b30 = 0x7f0000007f;
      uStack_b28 = 0x7f0000007f;
      local_bc0 = local_1260;
      uStack_bb8 = uStack_1258;
      uStack_bb0 = uStack_1250;
      uStack_ba8 = uStack_1248;
      local_be0 = 0x7f0000007f;
      uStack_bd8 = 0x7f0000007f;
      uStack_bd0 = 0x7f0000007f;
      uStack_bc8 = 0x7f0000007f;
      local_b70 = 0x7f0000007f;
      uStack_b68 = 0x7f0000007f;
      local_b80 = 0x7f0000007f;
      uStack_b78 = 0x7f0000007f;
      local_690 = local_1260;
      uStack_688 = uStack_1258;
      local_6a0 = 0x7f0000007f;
      uStack_698 = 0x7f0000007f;
      auVar26._8_8_ = uStack_1258;
      auVar26._0_8_ = local_1260;
      auVar25._8_8_ = 0x7f0000007f;
      auVar25._0_8_ = 0x7f0000007f;
      local_b50 = vpaddd_avx(auVar26,auVar25);
      local_6b0 = uStack_1250;
      uStack_6a8 = uStack_1248;
      local_6c0 = 0x7f0000007f;
      uStack_6b8 = 0x7f0000007f;
      auVar3._8_8_ = uStack_1248;
      auVar3._0_8_ = uStack_1250;
      auVar7._8_8_ = 0x7f0000007f;
      auVar7._0_8_ = 0x7f0000007f;
      local_b60 = vpaddd_avx(auVar3,auVar7);
      local_c00 = local_b50._0_8_;
      uStack_bf8 = local_b50._8_8_;
      uStack_bf0 = local_b60._0_8_;
      uStack_be8 = local_b60._8_8_;
      local_ba0 = local_b50._0_8_;
      uStack_b98 = local_b50._8_8_;
      uStack_b90 = local_b60._0_8_;
      uStack_b88 = local_b60._8_8_;
      local_a60 = local_b50._0_8_;
      uStack_a58 = local_b50._8_8_;
      uStack_a50 = local_b60._0_8_;
      uStack_a48 = local_b60._8_8_;
      local_a64 = 0x17;
      local_ae0 = local_b50._0_8_;
      uStack_ad8 = local_b50._8_8_;
      uStack_ad0 = local_b60._0_8_;
      uStack_ac8 = local_b60._8_8_;
      local_650 = local_b50._0_8_;
      uStack_648 = local_b50._8_8_;
      local_654 = 0x17;
      local_a80 = vpslld_avx(local_b50,ZEXT416(0x17));
      local_670 = local_b60._0_8_;
      uStack_668 = local_b60._8_8_;
      local_674 = 0x17;
      local_a90 = vpslld_avx(local_b60,ZEXT416(0x17));
      local_b00 = local_a80._0_8_;
      uStack_af8 = local_a80._8_8_;
      uStack_af0 = local_a90._0_8_;
      uStack_ae8 = local_a90._8_8_;
      local_ac0 = local_a80._0_8_;
      uStack_ab8 = local_a80._8_8_;
      uStack_ab0 = local_a90._0_8_;
      uStack_aa8 = local_a90._8_8_;
      local_1260 = local_a80._0_8_;
      uStack_1258 = local_a80._8_8_;
      uStack_1250 = local_a90._0_8_;
      uStack_1248 = local_a90._8_8_;
      local_a40 = local_a80._0_8_;
      uStack_a38 = local_a80._8_8_;
      uStack_a30 = local_a90._0_8_;
      uStack_a28 = local_a90._8_8_;
      local_12e0 = local_a80._0_8_;
      uStack_12d8 = local_a80._8_8_;
      uStack_12d0 = local_a90._0_8_;
      uStack_12c8 = local_a90._8_8_;
      local_1060 = local_12c0;
      uStack_1058 = uStack_12b8;
      uStack_12b0 = auVar44._16_8_;
      uStack_1050 = uStack_12b0;
      uStack_12a8 = auVar5._24_8_;
      uStack_1048 = uStack_12a8;
      local_1080._0_4_ = local_a80._0_4_;
      local_1080._4_4_ = local_a80._4_4_;
      uStack_1078._0_4_ = local_a80._8_4_;
      uStack_1078._4_4_ = local_a80._12_4_;
      uStack_1070._0_4_ = local_a90._0_4_;
      uStack_1070._4_4_ = local_a90._4_4_;
      uStack_1068._0_4_ = local_a90._8_4_;
      local_12c0._4_4_ = (local_10e0._4_4_ + 1.0) * local_1080._4_4_;
      local_12c0._0_4_ = ((float)local_10e0 + 1.0) * (float)local_1080;
      uStack_12b8._0_4_ = ((float)uStack_10d8 + 1.0) * (float)uStack_1078;
      uStack_12b8._4_4_ = (uStack_10d8._4_4_ + 1.0) * uStack_1078._4_4_;
      uStack_12b0._0_4_ = (float)uStack_1070 * 1.0;
      uStack_12b0._4_4_ = uStack_1070._4_4_ * 1.0;
      auVar44 = _local_12c0;
      uStack_12a8._0_4_ = (float)uStack_1068 * 1.0;
      uStack_12a8._4_4_ = 0x3f800000;
      auVar6 = _local_12c0;
      local_1300 = local_12c0;
      uStack_12f8 = uStack_12b8;
      uStack_12b0 = auVar44._16_8_;
      uStack_12f0 = uStack_12b0;
      uStack_12a8 = auVar6._24_8_;
      uStack_12e8 = uStack_12a8;
      local_1594 = 0x3f800000;
      local_1440 = 0x3f800000;
      auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar47._16_16_ = auVar7;
      auVar47._0_16_ = auVar3;
      local_1460._0_8_ = auVar3._0_8_;
      local_1320 = local_1460._0_8_;
      local_1460._8_8_ = auVar3._8_8_;
      uStack_1318 = local_1460._8_8_;
      local_1460._16_8_ = auVar7._0_8_;
      uStack_1310 = local_1460._16_8_;
      local_1460._24_8_ = auVar7._8_8_;
      uStack_1308 = local_1460._24_8_;
      auVar4._16_8_ = uStack_12b0;
      auVar4._0_16_ = _local_12c0;
      auVar4._24_8_ = uStack_12a8;
      auVar5._16_8_ = local_1460._16_8_;
      auVar5._0_16_ = auVar3;
      auVar5._24_8_ = local_1460._24_8_;
      local_1620 = vsubps_avx(auVar4,auVar5);
      local_fe0._0_4_ = auVar2._0_4_;
      local_fe0._4_4_ = auVar2._4_4_;
      uStack_fd8._0_4_ = auVar2._8_4_;
      uStack_fd8._4_4_ = auVar2._12_4_;
      uStack_fd0._0_4_ = auVar1._0_4_;
      uStack_fd0._4_4_ = auVar1._4_4_;
      uStack_fc8._0_4_ = auVar1._8_4_;
      uStack_fc8._4_4_ = auVar1._12_4_;
      fStack_10a4 = uStack_fc8._4_4_;
      local_1000._0_4_ = local_1620._0_4_;
      local_1000._4_4_ = local_1620._4_4_;
      uStack_ff8._0_4_ = local_1620._8_4_;
      uStack_ff8._4_4_ = local_1620._12_4_;
      uStack_ff0._0_4_ = local_1620._16_4_;
      uStack_ff0._4_4_ = local_1620._20_4_;
      uStack_fe8._0_4_ = local_1620._24_4_;
      local_10c0 = (float)local_fe0 * (float)local_1000;
      fStack_10bc = local_fe0._4_4_ * local_1000._4_4_;
      fStack_10b8 = (float)uStack_fd8 * (float)uStack_ff8;
      fStack_10b4 = uStack_fd8._4_4_ * uStack_ff8._4_4_;
      fStack_10b0 = (float)uStack_fd0 * (float)uStack_ff0;
      fStack_10ac = uStack_fd0._4_4_ * uStack_ff0._4_4_;
      fStack_10a8 = (float)uStack_fc8 * (float)uStack_fe8;
      local_10a0._0_4_ = local_1600._0_4_;
      local_10a0._4_4_ = local_1600._4_4_;
      fStack_1098 = local_1600._8_4_;
      fStack_1094 = local_1600._12_4_;
      fStack_1090 = local_1600._16_4_;
      fStack_108c = local_1600._20_4_;
      fStack_1088 = local_1600._24_4_;
      fStack_1084 = local_1600._28_4_;
      local_1660 = (float)local_10a0._0_4_ + local_10c0;
      fStack_165c = (float)local_10a0._4_4_ + fStack_10bc;
      fStack_1658 = fStack_1098 + fStack_10b8;
      fStack_1654 = fStack_1094 + fStack_10b4;
      fStack_1650 = fStack_1090 + fStack_10b0;
      fStack_164c = fStack_108c + fStack_10ac;
      fStack_1648 = fStack_1088 + fStack_10a8;
      fStack_1644 = fStack_1084 + uStack_fc8._4_4_;
      *(ulong *)*local_16e0 = CONCAT44(fStack_165c,local_1660);
      *(ulong *)(*local_16e0 + 8) = CONCAT44(fStack_1654,fStack_1658);
      *(ulong *)(*local_16e0 + 0x10) = CONCAT44(fStack_164c,fStack_1650);
      *(ulong *)(*local_16e0 + 0x18) = CONCAT44(fStack_1644,fStack_1648);
      local_16e0 = local_16e0 + 1;
      local_1460 = auVar47;
      local_143c = local_1440;
      local_1438 = local_1440;
      local_1434 = local_1440;
      local_1430 = local_1440;
      local_142c = local_1440;
      local_1428 = local_1440;
      local_1424 = local_1440;
      local_13e0 = local_15c0;
      uStack_13d8 = uStack_15b8;
      uStack_13d0 = uStack_15b0;
      uStack_13c8 = uStack_15a8;
      local_1380 = local_13a0;
      local_1360 = local_15c0;
      uStack_1358 = uStack_15b8;
      uStack_1350 = uStack_15b0;
      uStack_1348 = uStack_15a8;
      _local_12c0 = auVar6;
      _local_1220 = auVar13;
      local_1200 = ZEXT1632(auVar8);
      local_10e0 = uVar9;
      uStack_10d8 = uVar10;
      _local_10a0 = local_1600;
      local_1080 = local_a80._0_8_;
      uStack_1078 = local_a80._8_8_;
      uStack_1070 = local_a90._0_8_;
      uStack_1068 = local_a90._8_8_;
      local_1020 = local_1040;
      uStack_1018 = uStack_1038;
      uStack_1010 = uStack_1030;
      uStack_1008 = uStack_1028;
      local_1000 = local_1620._0_8_;
      uStack_ff8 = local_1620._8_8_;
      uStack_ff0 = local_1620._16_8_;
      uStack_fe8 = local_1620._24_8_;
      local_fe0 = local_1420._0_8_;
      uStack_fd8 = local_1420._8_8_;
      uStack_fd0 = local_1420._16_8_;
      uStack_fc8 = local_1420._24_8_;
      local_d80 = local_f60;
      uStack_d78 = uStack_f58;
      uStack_d70 = uStack_f50;
      uStack_d68 = uStack_f48;
      local_c20 = local_1240._0_8_;
      uStack_c18 = local_1240._8_8_;
      uStack_c10 = local_1240._16_8_;
      uStack_c08 = local_1240._24_8_;
    }
    local_1590 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    for (; fStack_158c = local_1590, fStack_1588 = local_1590, fStack_1584 = local_1590,
        local_157c = local_1590, local_1490 = local_1680, local_1420 = auVar46,
        local_1400 = local_166c, local_13fc = local_166c, local_13f8 = local_166c,
        local_13f4 = local_166c, local_13f0 = local_166c, local_13ec = local_166c,
        local_13e8 = local_166c, local_13e4 = local_166c, local_1708 = local_14f0,
        local_1738 + 3 < local_16d4; local_1738 = local_1738 + 4) {
      local_1578 = local_16e0;
      local_1520 = *(undefined8 *)*local_16e0;
      uStack_1518 = *(undefined8 *)(*local_16e0 + 8);
      local_1558 = local_16e0;
      local_620 = ZEXT816(0) << 0x20;
      local_630 = 0;
      local_610._8_8_ = SUB168(ZEXT816(0),4);
      uStack_628 = local_610._8_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_610._8_8_;
      local_1540 = vmaxps_avx(auVar42 << 0x40,*(undefined1 (*) [16])*local_16e0);
      local_5f0 = 0;
      uStack_5e8 = local_610._8_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_610._8_8_;
      auVar1 = vminps_avx(auVar43 << 0x40,*(undefined1 (*) [16])*local_16e0);
      local_1550._0_8_ = auVar1._0_8_;
      local_1550._8_8_ = auVar1._8_8_;
      local_590 = 0x3f8000003f800000;
      uStack_588 = 0x3f8000003f800000;
      local_4c0 = local_1550._0_8_;
      uStack_4b8 = local_1550._8_8_;
      local_4d0 = 0x42b0c0a542b0c0a5;
      uStack_4c8 = 0x42b0c0a542b0c0a5;
      auVar29._8_8_ = 0x42b0c0a542b0c0a5;
      auVar29._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar29);
      local_550._0_8_ = auVar1._0_8_;
      local_4f0 = local_550._0_8_;
      local_550._8_8_ = auVar1._8_8_;
      uStack_4e8 = local_550._8_8_;
      local_500 = 0xc2b0c0a5c2b0c0a5;
      uStack_4f8 = 0xc2b0c0a5c2b0c0a5;
      auVar28._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7 = vmaxps_avx(auVar1,auVar28);
      local_550._0_8_ = auVar7._0_8_;
      uVar9 = local_550._0_8_;
      local_550._8_8_ = auVar7._8_8_;
      uVar10 = local_550._8_8_;
      local_3f0 = 0x3fb8aa3b3fb8aa3b;
      uStack_3e8 = 0x3fb8aa3b3fb8aa3b;
      local_3e0._0_4_ = auVar7._0_4_;
      local_3e0._4_4_ = auVar7._4_4_;
      uStack_3d8._0_4_ = auVar7._8_4_;
      uStack_3d8._4_4_ = auVar7._12_4_;
      local_570._4_4_ = local_3e0._4_4_ * 1.442695;
      local_570._0_4_ = (float)local_3e0 * 1.442695;
      uStack_568._0_4_ = (float)uStack_3d8 * 1.442695;
      uStack_568._4_4_ = uStack_3d8._4_4_ * 1.442695;
      local_460 = local_570;
      uStack_458 = uStack_568;
      local_470 = 0x3f0000003f000000;
      uStack_468 = 0x3f0000003f000000;
      local_570._0_4_ = (float)local_3e0 * 1.442695 + 0.5;
      local_570._4_4_ = local_3e0._4_4_ * 1.442695 + 0.5;
      fVar48 = (float)uStack_3d8 * 1.442695 + 0.5;
      fVar49 = uStack_3d8._4_4_ * 1.442695 + 0.5;
      uStack_568._0_4_ = fVar48;
      uStack_568._4_4_ = fVar49;
      local_3a0 = local_570;
      uStack_398 = uStack_568;
      local_580._4_4_ = (int)(float)local_570._4_4_;
      local_580._0_4_ = (int)(float)local_570._0_4_;
      local_580._8_4_ = (int)fVar48;
      local_580._12_4_ = (int)fVar49;
      local_390 = local_580._0_8_;
      uStack_388 = local_580._8_8_;
      auVar30._8_8_ = local_580._8_8_;
      auVar30._0_8_ = local_580._0_8_;
      auVar2 = vcvtdq2ps_avx(auVar30);
      local_560 = auVar2._0_8_;
      local_370 = local_560;
      uStack_558 = auVar2._8_8_;
      uStack_368 = uStack_558;
      local_380 = local_570;
      uStack_378 = uStack_568;
      auVar31._8_8_ = uStack_568;
      auVar31._0_8_ = local_570;
      auVar1 = vcmpps_avx(auVar31,auVar2,1);
      local_5a0._0_8_ = auVar1._0_8_;
      local_350 = local_5a0._0_8_;
      local_5a0._8_8_ = auVar1._8_8_;
      uStack_348 = local_5a0._8_8_;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      auVar32._8_8_ = 0x3f8000003f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      local_5a0 = vpand_avx(auVar1,auVar32);
      local_4a0 = local_560;
      uStack_498 = uStack_558;
      local_4b0 = local_5a0._0_8_;
      uStack_4a8 = local_5a0._8_8_;
      _local_570 = vsubps_avx(auVar2,local_5a0);
      local_2f0 = local_570;
      uStack_2e8 = uStack_568;
      local_310 = local_550._0_8_;
      uStack_308 = local_550._8_8_;
      local_300 = 0x3f3180003f318000;
      uStack_2f8 = 0x3f3180003f318000;
      local_190 = local_570;
      uStack_188 = uStack_568;
      local_1a0 = 0x3f3180003f318000;
      uStack_198 = 0x3f3180003f318000;
      local_1b0 = local_550._0_8_;
      uStack_1a8 = local_550._8_8_;
      auVar33._8_8_ = 0x3f3180003f318000;
      auVar33._0_8_ = 0x3f3180003f318000;
      auVar1 = vfnmadd213ps_fma(auVar33,_local_570,auVar7);
      local_320 = local_570;
      uStack_318 = uStack_568;
      local_550._0_8_ = auVar1._0_8_;
      local_340 = local_550._0_8_;
      local_550._8_8_ = auVar1._8_8_;
      uStack_338 = local_550._8_8_;
      local_330 = 0xb95e8083b95e8083;
      uStack_328 = 0xb95e8083b95e8083;
      local_160 = local_570;
      uStack_158 = uStack_568;
      local_170 = 0xb95e8083b95e8083;
      uStack_168 = 0xb95e8083b95e8083;
      local_180 = local_550._0_8_;
      uStack_178 = local_550._8_8_;
      auVar34._8_8_ = 0xb95e8083b95e8083;
      auVar34._0_8_ = 0xb95e8083b95e8083;
      local_550 = vfnmadd213ps_fma(auVar34,_local_570,auVar1);
      local_410 = local_550._0_8_;
      uStack_408 = local_550._8_8_;
      local_400._0_4_ = local_550._0_4_;
      local_400._4_4_ = local_550._4_4_;
      uStack_3f8._0_4_ = local_550._8_4_;
      uStack_3f8._4_4_ = local_550._12_4_;
      local_560 = CONCAT44(local_400._4_4_ * local_400._4_4_,(float)local_400 * (float)local_400);
      uStack_558._0_4_ = (float)uStack_3f8 * (float)uStack_3f8;
      uStack_558._4_4_ = uStack_3f8._4_4_ * uStack_3f8._4_4_;
      local_1d0 = 0x3950696739506967;
      uStack_1c8 = 0x3950696739506967;
      local_1e0 = local_550._0_8_;
      uStack_1d8 = local_550._8_8_;
      local_1f0 = 0x3ab743ce3ab743ce;
      uStack_1e8 = 0x3ab743ce3ab743ce;
      local_130 = 0x3950696739506967;
      uStack_128 = 0x3950696739506967;
      local_140 = local_550._0_8_;
      uStack_138 = local_550._8_8_;
      local_150 = 0x3ab743ce3ab743ce;
      uStack_148 = 0x3ab743ce3ab743ce;
      auVar36._8_8_ = 0x3950696739506967;
      auVar36._0_8_ = 0x3950696739506967;
      auVar35._8_8_ = 0x3ab743ce3ab743ce;
      auVar35._0_8_ = 0x3ab743ce3ab743ce;
      auVar1 = vfmadd213ps_fma(local_550,auVar36,auVar35);
      local_5b0 = auVar1._0_8_;
      local_200 = local_5b0;
      uStack_5a8 = auVar1._8_8_;
      uStack_1f8 = uStack_5a8;
      local_210 = local_550._0_8_;
      uStack_208 = local_550._8_8_;
      local_220 = 0x3c0889083c088908;
      uStack_218 = 0x3c0889083c088908;
      local_100 = local_5b0;
      uStack_f8 = uStack_5a8;
      local_110 = local_550._0_8_;
      uStack_108 = local_550._8_8_;
      local_120 = 0x3c0889083c088908;
      uStack_118 = 0x3c0889083c088908;
      auVar37._8_8_ = 0x3c0889083c088908;
      auVar37._0_8_ = 0x3c0889083c088908;
      auVar1 = vfmadd213ps_fma(local_550,auVar1,auVar37);
      local_5b0 = auVar1._0_8_;
      local_230 = local_5b0;
      uStack_5a8 = auVar1._8_8_;
      uStack_228 = uStack_5a8;
      local_240 = local_550._0_8_;
      uStack_238 = local_550._8_8_;
      local_250 = 0x3d2aa9c13d2aa9c1;
      uStack_248 = 0x3d2aa9c13d2aa9c1;
      local_d0 = local_5b0;
      uStack_c8 = uStack_5a8;
      local_e0 = local_550._0_8_;
      uStack_d8 = local_550._8_8_;
      local_f0 = 0x3d2aa9c13d2aa9c1;
      uStack_e8 = 0x3d2aa9c13d2aa9c1;
      auVar38._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar38._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1 = vfmadd213ps_fma(local_550,auVar1,auVar38);
      local_5b0 = auVar1._0_8_;
      local_260 = local_5b0;
      uStack_5a8 = auVar1._8_8_;
      uStack_258 = uStack_5a8;
      local_270 = local_550._0_8_;
      uStack_268 = local_550._8_8_;
      local_280 = 0x3e2aaaaa3e2aaaaa;
      uStack_278 = 0x3e2aaaaa3e2aaaaa;
      local_a0 = local_5b0;
      uStack_98 = uStack_5a8;
      local_b0 = local_550._0_8_;
      uStack_a8 = local_550._8_8_;
      local_c0 = 0x3e2aaaaa3e2aaaaa;
      uStack_b8 = 0x3e2aaaaa3e2aaaaa;
      auVar39._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar39._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1 = vfmadd213ps_fma(local_550,auVar1,auVar39);
      local_5b0 = auVar1._0_8_;
      local_290 = local_5b0;
      uStack_5a8 = auVar1._8_8_;
      uStack_288 = uStack_5a8;
      local_2a0 = local_550._0_8_;
      uStack_298 = local_550._8_8_;
      local_70 = local_5b0;
      uStack_68 = uStack_5a8;
      local_80 = local_550._0_8_;
      uStack_78 = local_550._8_8_;
      local_90 = 0x3f0000003f000000;
      uStack_88 = 0x3f0000003f000000;
      auVar40._8_8_ = 0x3f0000003f000000;
      auVar40._0_8_ = 0x3f0000003f000000;
      auVar1 = vfmadd213ps_fma(local_550,auVar1,auVar40);
      local_5b0 = auVar1._0_8_;
      local_2c0 = local_5b0;
      uStack_5a8 = auVar1._8_8_;
      uStack_2b8 = uStack_5a8;
      local_2d0 = local_560;
      uStack_2c8 = uStack_558;
      local_2e0 = local_550._0_8_;
      uStack_2d8 = local_550._8_8_;
      local_40 = local_5b0;
      uStack_38 = uStack_5a8;
      local_50 = local_560;
      uStack_48 = uStack_558;
      local_60 = local_550._0_8_;
      uStack_58 = local_550._8_8_;
      auVar41._8_8_ = uStack_558;
      auVar41._0_8_ = local_560;
      auVar1 = vfmadd213ps_fma(auVar41,auVar1,local_550);
      local_5b0 = auVar1._0_8_;
      uVar11 = local_5b0;
      uStack_5a8 = auVar1._8_8_;
      uVar12 = uStack_5a8;
      local_490 = 0x3f8000003f800000;
      uStack_488 = 0x3f8000003f800000;
      local_480._0_4_ = auVar1._0_4_;
      local_480._4_4_ = auVar1._4_4_;
      uStack_478._0_4_ = auVar1._8_4_;
      uStack_478._4_4_ = auVar1._12_4_;
      local_5b0 = CONCAT44(local_480._4_4_ + 1.0,(float)local_480 + 1.0);
      uStack_5a8._0_4_ = (float)uStack_478 + 1.0;
      uStack_5a8._4_4_ = uStack_478._4_4_ + 1.0;
      local_3b0._0_4_ = local_570._0_4_;
      local_3b0._4_4_ = local_570._4_4_;
      uStack_3a8._0_4_ = local_570._8_4_;
      uStack_3a8._4_4_ = local_570._12_4_;
      local_580._4_4_ = (int)local_3b0._4_4_;
      local_580._0_4_ = (int)(float)local_3b0;
      local_580._8_4_ = (int)(float)uStack_3a8;
      local_580._12_4_ = (int)uStack_3a8._4_4_;
      local_530 = local_580._0_8_;
      uStack_528 = local_580._8_8_;
      local_540 = 0x7f0000007f;
      uStack_538 = 0x7f0000007f;
      auVar27._8_8_ = local_580._8_8_;
      auVar27._0_8_ = local_580._0_8_;
      auVar8._8_8_ = 0x7f0000007f;
      auVar8._0_8_ = 0x7f0000007f;
      auVar1 = vpaddd_avx(auVar27,auVar8);
      local_580._0_8_ = auVar1._0_8_;
      local_510 = local_580._0_8_;
      local_580._8_8_ = auVar1._8_8_;
      uStack_508 = local_580._8_8_;
      local_514 = 0x17;
      local_580 = vpslld_avx(auVar1,ZEXT416(0x17));
      local_1c0 = local_580._0_8_;
      uStack_1b8 = local_580._8_8_;
      local_5c0 = local_580._0_8_;
      uStack_5b8 = local_580._8_8_;
      local_420 = local_5b0;
      uStack_418 = uStack_5a8;
      local_430._0_4_ = local_580._0_4_;
      local_430._4_4_ = local_580._4_4_;
      uStack_428._0_4_ = local_580._8_4_;
      uStack_428._4_4_ = local_580._12_4_;
      local_5b0 = CONCAT44((local_480._4_4_ + 1.0) * local_430._4_4_,
                           ((float)local_480 + 1.0) * (float)local_430);
      uStack_5a8._0_4_ = ((float)uStack_478 + 1.0) * (float)uStack_428;
      uStack_5a8._4_4_ = (uStack_478._4_4_ + 1.0) * uStack_428._4_4_;
      local_5d0 = local_5b0;
      uStack_5c8 = uStack_5a8;
      local_14f4 = 0x3f800000;
      local_1510 = 0x3f800000;
      local_5e0 = 0x3f8000003f800000;
      uStack_5d8 = 0x3f8000003f800000;
      auVar2._8_8_ = uStack_5a8;
      auVar2._0_8_ = local_5b0;
      auVar1._8_8_ = 0x3f8000003f800000;
      auVar1._0_8_ = 0x3f8000003f800000;
      local_1550 = vsubps_avx(auVar2,auVar1);
      local_3d0._0_4_ = local_1550._0_4_;
      local_3d0._4_4_ = local_1550._4_4_;
      uStack_3c8._0_4_ = local_1550._8_4_;
      uStack_3c8._4_4_ = local_1550._12_4_;
      local_450 = local_1590 * (float)local_3d0;
      fStack_44c = local_1590 * local_3d0._4_4_;
      fStack_448 = local_1590 * (float)uStack_3c8;
      fStack_444 = local_1590 * uStack_3c8._4_4_;
      local_440._0_4_ = local_1540._0_4_;
      local_440._4_4_ = local_1540._4_4_;
      fStack_438 = local_1540._8_4_;
      fStack_434 = local_1540._12_4_;
      local_1570 = (float)local_440._0_4_ + local_450;
      fStack_156c = (float)local_440._4_4_ + fStack_44c;
      fStack_1568 = fStack_438 + fStack_448;
      fStack_1564 = fStack_434 + fStack_444;
      *(ulong *)*local_16e0 = CONCAT44(fStack_156c,local_1570);
      *(ulong *)(*local_16e0 + 8) = CONCAT44(fStack_1564,fStack_1568);
      local_16e0 = (undefined1 (*) [32])(*local_16e0 + 0x10);
      local_1530 = CONCAT44(local_1590,local_1590);
      uStack_1528 = CONCAT44(local_1590,local_1590);
      uStack_150c = local_1510;
      uStack_1508 = local_1510;
      uStack_1504 = local_1510;
      local_640 = local_1520;
      uStack_638 = uStack_1518;
      local_610 = local_620;
      local_600 = local_1520;
      uStack_5f8 = uStack_1518;
      local_4e0 = local_620;
      local_480 = uVar11;
      uStack_478 = uVar12;
      _local_440 = local_1540;
      local_430 = local_580._0_8_;
      uStack_428 = local_580._8_8_;
      local_400 = local_410;
      uStack_3f8 = uStack_408;
      local_3e0 = uVar9;
      uStack_3d8 = uVar10;
      local_3d0 = local_1550._0_8_;
      uStack_3c8 = local_1550._8_8_;
      local_3c0 = CONCAT44(local_1590,local_1590);
      uStack_3b8 = CONCAT44(local_1590,local_1590);
      local_3b0 = local_570;
      uStack_3a8 = uStack_568;
      local_2b0 = local_470;
      uStack_2a8 = uStack_468;
    }
    for (; local_1738 < local_16d4; local_1738 = local_1738 + 1) {
      if (*(float *)*local_16e0 < 0.0) {
        fVar48 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        dVar45 = std::exp((double)(ulong)*(uint *)*local_16e0);
        *(float *)*local_16e0 = fVar48 * (SUB84(dVar45,0) - 1.0);
      }
      local_16e0 = (undefined1 (*) [32])(*local_16e0 + 4);
    }
  }
  return 0;
}

Assistant:

int ELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = static_cast<float>(alpha * (exp(*ptr) - 1.f));
            ptr++;
        }
    }

    return 0;
}